

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_7::ToValueString<short>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  string local_88;
  string local_68;
  ulong local_48;
  uint64_t i;
  uint64_t start_index;
  short val;
  undefined1 local_21;
  uint8_t *local_20;
  uint8_t *binary_local;
  BinaryRegion *region_local;
  string *s;
  
  local_21 = 0;
  local_20 = binary;
  binary_local = (uint8_t *)region;
  region_local = (BinaryRegion *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0x");
  start_index._2_2_ = ReadScalar<short>(local_20 + *(long *)binary_local);
  i = (*(long *)binary_local + *(long *)(binary_local + 8)) - 1;
  for (local_48 = 0; local_48 < *(ulong *)(binary_local + 8); local_48 = local_48 + 1) {
    ToHex_abi_cxx11_(&local_68,(flatbuffers *)(ulong)local_20[i - local_48],(uint8_t)local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," (");
  ToString<short>(&local_88,start_index._2_2_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}